

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qshareddata.h
# Opt level: O2

void __thiscall
QSharedDataPointer<QStyleSheetOutlineData>::detach_helper
          (QSharedDataPointer<QStyleSheetOutlineData> *this)

{
  QStyleSheetOutlineData *pQVar1;
  int iVar2;
  undefined4 extraout_var;
  int in_ECX;
  void *in_RDX;
  __fn *in_RSI;
  void *in_R8;
  QStyleSheetOutlineData *pQVar3;
  
  iVar2 = clone(this,in_RSI,in_RDX,in_ECX,in_R8);
  pQVar3 = (QStyleSheetOutlineData *)CONCAT44(extraout_var,iVar2);
  LOCK();
  (pQVar3->super_QStyleSheetBorderData).super_QSharedData.ref.super_QAtomicInteger<int>.
  super_QBasicAtomicInteger<int>._q_value =
       (Type)((int)(pQVar3->super_QStyleSheetBorderData).super_QSharedData.ref.
                   super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value + 1);
  UNLOCK();
  pQVar1 = (this->d).ptr;
  LOCK();
  (pQVar1->super_QStyleSheetBorderData).super_QSharedData.ref.super_QAtomicInteger<int>.
  super_QBasicAtomicInteger<int>._q_value =
       (Type)((int)(pQVar1->super_QStyleSheetBorderData).super_QSharedData.ref.
                   super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value + -1);
  UNLOCK();
  if ((__atomic_base<int>)
      *(__int_type *)
       &(pQVar1->super_QStyleSheetBorderData).super_QSharedData.ref.super_QAtomicInteger<int>.
        super_QBasicAtomicInteger<int>._q_value == (__atomic_base<int>)0x0) {
    pQVar1 = (this->d).ptr;
    if (pQVar1 != (QStyleSheetOutlineData *)0x0) {
      QStyleSheetBorderData::~QStyleSheetBorderData(&pQVar1->super_QStyleSheetBorderData);
    }
    operator_delete(pQVar1,0x80);
  }
  (this->d).ptr = pQVar3;
  return;
}

Assistant:

Q_OUTOFLINE_TEMPLATE void QSharedDataPointer<T>::detach_helper()
{
    T *x = clone();
    x->ref.ref();
    if (!d.get()->ref.deref())
        delete d.get();
    d.reset(x);
}